

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O0

void __thiscall QHttpThreadDelegate::readBufferSizeChanged(QHttpThreadDelegate *this,qint64 size)

{
  QHttpNetworkReply *in_RSI;
  long in_RDI;
  QHttpNetworkReply *unaff_retaddr;
  
  if (*(long *)(in_RDI + 0x150) != 0) {
    QHttpNetworkReply::setDownstreamLimited(unaff_retaddr,SUB81((ulong)in_RDI >> 0x38,0));
    QHttpNetworkReply::setReadBufferSize(in_RSI,in_RDI);
    *(QHttpNetworkReply **)(in_RDI + 0x38) = in_RSI;
  }
  return;
}

Assistant:

void QHttpThreadDelegate::readBufferSizeChanged(qint64 size)
{
#ifdef QHTTPTHREADDELEGATE_DEBUG
    qDebug() << "QHttpThreadDelegate::readBufferSizeChanged() size " << size;
#endif
    if (httpReply) {
        httpReply->setDownstreamLimited(size > 0);
        httpReply->setReadBufferSize(size);
        readBufferMaxSize = size;
    }
}